

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

Am_Object in_target(Am_Object *top_level,Am_Object *in_leaf,Am_Object *event_window,int x,int y)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  int x_00;
  uint in_R9D;
  Am_Object owner;
  Am_Object leaf;
  Am_Object new_leaf;
  Am_Object local_68;
  Am_Value target_value;
  Am_Object local_48;
  Am_Value_List parts;
  
  pAVar2 = Am_Object::Get(event_window,0x1a1,1);
  Am_Value::Am_Value(&target_value,pAVar2);
  bVar1 = Am_Value::Valid(&target_value);
  if (!bVar1) {
    bVar1 = Am_Object::operator==(event_window,in_leaf);
    if (!bVar1) {
      Am_Object::Get_Owner(&owner,(Am_Slot_Flags)event_window);
      Am_Object::Am_Object(&leaf,event_window);
      while( true ) {
        Am_Object::Am_Object(&local_68,in_leaf);
        bVar1 = Am_Object::Is_Part_Of(&owner,&local_68);
        Am_Object::~Am_Object(&local_68);
        if (!bVar1) break;
        pAVar2 = Am_Object::Get(&owner,0x82,0);
        Am_Value_List::Am_Value_List(&parts,pAVar2);
        Am_Value_List::Start(&parts);
        value = Am_Object::operator_cast_to_Am_Wrapper_(&leaf);
        Am_Value_List::Member(&parts,value);
        Am_Value_List::Prev(&parts);
        while( true ) {
          bVar1 = Am_Value_List::First(&parts);
          if (bVar1) break;
          pAVar2 = Am_Value_List::Get(&parts);
          Am_Object::operator=(&leaf,pAVar2);
          x_00 = (int)&leaf;
          Am_Point_In_Obj(&new_leaf,x_00,y,(Am_Object *)(ulong)in_R9D);
          bVar1 = Am_Object::Valid(&new_leaf);
          Am_Object::~Am_Object(&new_leaf);
          if (bVar1) {
            Am_Point_In_Leaf(&new_leaf,x_00,y,(Am_Object *)(ulong)in_R9D,SUB41(x,0),true);
            bVar1 = Am_Object::Valid(&new_leaf);
            if (bVar1) {
              in_target(&local_48,&leaf,&new_leaf,x,y);
              Am_Object::operator=(&leaf,&local_48);
              Am_Object::~Am_Object(&local_48);
              bVar1 = Am_Object::Valid(&leaf);
              if (bVar1) {
                Am_Object::Am_Object(top_level,&leaf);
                Am_Object::~Am_Object(&new_leaf);
                goto LAB_0025b0e9;
              }
            }
            Am_Object::~Am_Object(&new_leaf);
          }
          Am_Value_List::Prev(&parts);
        }
        Am_Object::operator=(&leaf,&owner);
        pAVar2 = Am_Object::Get(&leaf,0x1a1,1);
        Am_Value::operator=(&target_value,pAVar2);
        bVar1 = Am_Value::Valid(&target_value);
        if (bVar1) {
          Am_Object::Am_Object(top_level,&leaf);
LAB_0025b0e9:
          Am_Value_List::~Am_Value_List(&parts);
          goto LAB_0025b0f3;
        }
        Am_Object::Get_Owner(&new_leaf,(Am_Slot_Flags)&leaf);
        Am_Object::operator=(&owner,&new_leaf);
        Am_Object::~Am_Object(&new_leaf);
        Am_Value_List::~Am_Value_List(&parts);
      }
      Am_Object::Am_Object(top_level,&Am_No_Object);
LAB_0025b0f3:
      Am_Object::~Am_Object(&leaf);
      Am_Object::~Am_Object(&owner);
      goto LAB_0025b107;
    }
    event_window = &Am_No_Object;
  }
  Am_Object::Am_Object(top_level,event_window);
LAB_0025b107:
  Am_Value::~Am_Value(&target_value);
  return (Am_Object)(Am_Object_Data *)top_level;
}

Assistant:

static Am_Object
in_target(Am_Object &top_level, Am_Object &in_leaf, Am_Object &event_window,
          int x, int y)
{
  Am_Value target_value = in_leaf.Peek(Am_DROP_TARGET);
  if (target_value.Valid())
    return in_leaf;
  if (in_leaf == top_level)
    return Am_No_Object;
  Am_Object owner = in_leaf.Get_Owner();
  Am_Object leaf = in_leaf;
  while (owner.Is_Part_Of(top_level)) {
    Am_Value_List parts = owner.Get(Am_GRAPHICAL_PARTS);
    parts.Start();
    parts.Member(leaf);
    parts.Prev();
    while (!parts.First()) {
      leaf = parts.Get();
      if (Am_Point_In_Obj(leaf, x, y, event_window).Valid()) {
        Am_Object new_leaf = Am_Point_In_Leaf(leaf, x, y, event_window);
        if (new_leaf.Valid()) {
          leaf = in_target(leaf, new_leaf, event_window, x, y);
          if (leaf.Valid())
            return leaf;
        }
      }
      parts.Prev();
    }
    leaf = owner;
    target_value = leaf.Peek(Am_DROP_TARGET);
    if (target_value.Valid())
      return leaf;
    owner = leaf.Get_Owner();
  }
  return Am_No_Object;
}